

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O3

Mat * __thiscall
ncnn::ModelBinFromMemory::load(Mat *__return_storage_ptr__,ModelBinFromMemory *this,int w,int type)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte *pbVar6;
  uchar *puVar7;
  uchar *puVar8;
  int iVar9;
  uchar **ppuVar10;
  uint uVar11;
  ulong uVar12;
  size_t sVar13;
  void *pvVar14;
  void *ptr;
  void *local_38;
  
  ppuVar10 = this->mem;
  pbVar6 = *ppuVar10;
  if (pbVar6 != (byte *)0x0) {
    if (type == 1) {
      __return_storage_ptr__->data = pbVar6;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->elemsize = 4;
      __return_storage_ptr__->packing = 1;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 1;
      __return_storage_ptr__->w = w;
      __return_storage_ptr__->h = 1;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = (long)w;
      *ppuVar10 = *ppuVar10 + (long)w * 4;
      return __return_storage_ptr__;
    }
    if (type != 0) {
      fprintf(_stderr,"ModelBin load type %d not implemented\n",(ulong)(uint)type);
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
      goto LAB_00155666;
    }
    bVar2 = *pbVar6;
    bVar3 = pbVar6[1];
    bVar4 = pbVar6[2];
    bVar5 = pbVar6[3];
    *ppuVar10 = pbVar6 + 4;
    uVar11 = (uint)bVar3 << 8 | (uint)bVar4 << 0x10 | (uint)bVar5 << 0x18 | (uint)bVar2;
    if (uVar11 != 0x2c056) {
      if (uVar11 == 0xd4b38) {
        ppuVar10 = this->mem;
        __return_storage_ptr__->data = *ppuVar10;
        __return_storage_ptr__->refcount = (int *)0x0;
        __return_storage_ptr__->elemsize = 1;
        __return_storage_ptr__->packing = 1;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->dims = 1;
        __return_storage_ptr__->w = w;
        __return_storage_ptr__->h = 1;
        __return_storage_ptr__->c = 1;
        __return_storage_ptr__->cstep = (long)w;
        uVar12 = (long)w + 3U & 0xfffffffffffffffc;
        goto LAB_001556b3;
      }
      if (uVar11 == 0x1306b47) {
        Mat::from_float16(__return_storage_ptr__,(unsigned_short *)*this->mem,w);
        *this->mem = *this->mem + ((long)w * 2 + 3U & 0xfffffffffffffffc);
        return __return_storage_ptr__;
      }
      if ((uint)bVar3 + (uint)bVar2 + (uint)bVar4 != 0 || bVar5 != 0) {
        puVar7 = *this->mem;
        *this->mem = puVar7 + 0x400;
        puVar8 = *this->mem;
        sVar13 = (size_t)w;
        *this->mem = puVar8 + (sVar13 + 3 & 0xfffffffffffffffc);
        __return_storage_ptr__->data = (void *)0x0;
        __return_storage_ptr__->refcount = (int *)0x0;
        __return_storage_ptr__->elemsize = 4;
        __return_storage_ptr__->packing = 1;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->dims = 1;
        __return_storage_ptr__->w = w;
        __return_storage_ptr__->h = 1;
        __return_storage_ptr__->c = 1;
        __return_storage_ptr__->cstep = sVar13;
        if (w == 0) {
          return __return_storage_ptr__;
        }
        local_38 = (void *)0x0;
        iVar9 = posix_memalign(&local_38,0x10,sVar13 * 4 + 4);
        pvVar14 = (void *)0x0;
        if (iVar9 == 0) {
          pvVar14 = local_38;
        }
        __return_storage_ptr__->data = pvVar14;
        piVar1 = (int *)((long)pvVar14 + sVar13 * 4);
        __return_storage_ptr__->refcount = piVar1;
        *piVar1 = 1;
        if (w < 1 || (long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
          return __return_storage_ptr__;
        }
        uVar12 = 0;
        do {
          *(undefined4 *)((long)local_38 + uVar12 * 4) =
               *(undefined4 *)(puVar7 + (ulong)puVar8[uVar12] * 4);
          uVar12 = uVar12 + 1;
        } while ((uint)w != uVar12);
        return __return_storage_ptr__;
      }
      if (bVar2 != 0) goto LAB_0015565c;
    }
    ppuVar10 = this->mem;
    __return_storage_ptr__->data = *ppuVar10;
    __return_storage_ptr__->refcount = (int *)0x0;
    __return_storage_ptr__->elemsize = 4;
    __return_storage_ptr__->packing = 1;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 1;
    __return_storage_ptr__->w = w;
    __return_storage_ptr__->h = 1;
    __return_storage_ptr__->c = 1;
    __return_storage_ptr__->cstep = (long)w;
    uVar12 = (long)w << 2;
LAB_001556b3:
    *ppuVar10 = *ppuVar10 + uVar12;
    return __return_storage_ptr__;
  }
LAB_0015565c:
  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
LAB_00155666:
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->c = 0;
  __return_storage_ptr__->cstep = 0;
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBinFromMemory::load(int w, int type) const
{
    if (!mem)
        return Mat();

    if (type == 0)
    {
        union
        {
            struct
            {
                unsigned char f0;
                unsigned char f1;
                unsigned char f2;
                unsigned char f3;
            };
            unsigned int tag;
        } flag_struct;

        memcpy(&flag_struct, mem, sizeof(flag_struct));
        mem += sizeof(flag_struct);

        unsigned int flag = flag_struct.f0 + flag_struct.f1 + flag_struct.f2 + flag_struct.f3;

        if (flag_struct.tag == 0x01306B47)
        {
            // half-precision data
            Mat m = Mat::from_float16((unsigned short*)mem, w);
            mem += alignSize(w * sizeof(unsigned short), 4);
            return m;
        }
        else if (flag_struct.tag == 0x000D4B38)
        {
            // int8 data
            Mat m = Mat(w, (signed char*)mem, 1u);
            mem += alignSize(w, 4);
            return m;
        }
        else if (flag_struct.tag == 0x0002C056)
        {
            // raw data with extra scaling
            Mat m = Mat(w, (float*)mem);
            mem += w * sizeof(float);
            return m;
        }

        if (flag != 0)
        {
            // quantized data
            const float* quantization_value = (const float*)mem;
            mem += 256 * sizeof(float);

            const unsigned char* index_array = (const unsigned char*)mem;
            mem += alignSize(w * sizeof(unsigned char), 4);

            Mat m(w);
            if (m.empty())
                return m;

            float* ptr = m;
            for (int i = 0; i < w; i++)
            {
                ptr[i] = quantization_value[ index_array[i] ];
            }

            return m;
        }
        else if (flag_struct.f0 == 0)
        {
            // raw data
            Mat m = Mat(w, (float*)mem);
            mem += w * sizeof(float);
            return m;
        }
    }
    else if (type == 1)
    {
        // raw data
        Mat m = Mat(w, (float*)mem);
        mem += w * sizeof(float);
        return m;
    }
    else
    {
        fprintf(stderr, "ModelBin load type %d not implemented\n", type);
        return Mat();
    }

    return Mat();
}